

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_map.c
# Opt level: O1

Value removeKey(VM *vm,ObjMap *objMap,Value key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  uint32_t newCapacity;
  ValueType VVar4;
  anon_union_8_2_14f5a2bf_for_Value_1 aVar5;
  Value VVar6;
  Value key_00;
  
  key_00._4_4_ = 0;
  key_00.type = key.type;
  key_00.field_1.num = key.field_1.num;
  pEVar3 = findEntry(objMap,key_00);
  if (pEVar3 == (Entry *)0x0) {
    VVar4 = VT_NULL;
    aVar5.num = 0.0;
  }
  else {
    VVar4 = (pEVar3->value).type;
    aVar5 = (anon_union_8_2_14f5a2bf_for_Value_1)(pEVar3->value).field_1.objHeader;
    (pEVar3->key).type = VT_UNDEFINED;
    (pEVar3->key).field_1.num = 0.0;
    (pEVar3->value).type = VT_TRUE;
    (pEVar3->value).field_1.num = 0.0;
    uVar1 = objMap->count - 1;
    objMap->count = uVar1;
    if (uVar1 == 0) {
      memManager(vm,objMap->entries,0,0);
      objMap->capacity = 0;
      objMap->count = 0;
      objMap->entries = (Entry *)0x0;
    }
    else if ((0x40 < uVar1) && (uVar2 = objMap->capacity >> 2, (double)uVar1 < (double)uVar2 * 0.8))
    {
      newCapacity = 0x40;
      if (0x40 < uVar2) {
        newCapacity = uVar2;
      }
      resizeMap(vm,objMap,newCapacity);
    }
  }
  VVar6._4_4_ = 0;
  VVar6.type = VVar4;
  VVar6.field_1.num = aVar5.num;
  return VVar6;
}

Assistant:

Value removeKey(VM *vm, ObjMap *objMap, Value key) {
    Entry *entry = findEntry(objMap, key);

    if (entry == NULL) {
        return VT_TO_VALUE(VT_NULL);
    }

    // 开放定址的伪删除
    Value value = entry->value;
    entry->key = VT_TO_VALUE(VT_UNDEFINED);
    entry->value = VT_TO_VALUE(VT_TRUE); // 值为真,伪删除

    objMap->count--;
    if (objMap->count == 0) { // 若删除该entry后map为空就回收该空间
        clearMap(vm, objMap);
    } else if (objMap->count < objMap->capacity / (CAPACITY_GROW_FACTOR) * MAP_LOAD_PERCENT &&
               objMap->count > MIN_CAPACITY) { // 若map容量利用率太低,缩小map空间
        uint32_t newCapacity = objMap->capacity / CAPACITY_GROW_FACTOR;
        if (newCapacity < MIN_CAPACITY) {
            newCapacity = MIN_CAPACITY;
        }
        resizeMap(vm, objMap, newCapacity);
    }

    return value;
}